

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

void __thiscall Darts::Details::DoubleArrayBuilder::expand_units(DoubleArrayBuilder *this)

{
  uint uVar1;
  ulong uVar2;
  DoubleArrayBuilderExtraUnit *pDVar3;
  DoubleArrayBuilderExtraUnit *pDVar4;
  ulong uVar5;
  id_type iVar6;
  uint uVar7;
  int iVar8;
  bool *pbVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  
  uVar2 = (this->units_).size_;
  iVar6 = (id_type)uVar2;
  uVar1 = (uint)(uVar2 >> 8);
  uVar7 = uVar1 - 0x10;
  if (uVar7 < 0xffffffef) {
    pbVar9 = &((this->extras_).array_)->is_used_ + (uVar1 & 0xf) * 0xc00;
    iVar8 = 0;
    do {
      if (*pbVar9 != true) {
        bVar13 = -(char)iVar8;
        goto LAB_001f3bb2;
      }
      iVar8 = iVar8 + -1;
      pbVar9 = pbVar9 + 0xc;
    } while (iVar8 != -0x100);
    bVar13 = 0;
LAB_001f3bb2:
    lVar12 = (ulong)((uVar1 & 0xf) << 8) * 3 + 1;
    lVar11 = 0;
    do {
      if ((char)(&((this->extras_).array_)->next_)[lVar12] == '\0') {
        uVar10 = (ulong)(uVar7 * 0x100) + lVar11;
        if ((this->units_).size_ <= uVar10) {
          expand_units(this);
        }
        if ((uVar10 == this->extras_head_) &&
           (uVar1 = (&((this->extras_).array_)->prev_)[lVar12], this->extras_head_ = uVar1,
           uVar10 == uVar1)) {
          this->extras_head_ = (id_type)(this->units_).size_;
        }
        pDVar3 = (this->extras_).array_;
        uVar1 = *(uint *)((long)pDVar3 + lVar12 * 4 + -4);
        pDVar3[(ulong)uVar1 & 0xfff].next_ = (&pDVar3->prev_)[lVar12];
        pDVar3[(ulong)(&pDVar3->prev_)[lVar12] & 0xfff].prev_ = uVar1;
        *(undefined1 *)(&pDVar3->next_ + lVar12) = 1;
        (this->units_).buf_.array_[lVar11 * 4 + (ulong)(uVar7 * 0x100) * 4] = (byte)lVar11 ^ bVar13;
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 3;
    } while ((int)lVar11 != 0x100);
  }
  uVar10 = (ulong)(iVar6 + 0x100);
  AutoPool<Darts::Details::DoubleArrayBuilderUnit>::resize(&this->units_,uVar10);
  if ((uVar7 < 0xffffffef) && (uVar5 = uVar2 & 0xffffffff, uVar5 < uVar10)) {
    pDVar3 = (this->extras_).array_;
    do {
      pDVar4 = pDVar3 + ((uint)uVar5 & 0xfff);
      pDVar4->is_fixed_ = false;
      pDVar4->is_used_ = false;
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  if (iVar6 + 1 < iVar6 + 0x100) {
    pDVar3 = (this->extras_).array_;
    iVar8 = 0xff;
    uVar10 = uVar2 & 0xffffffff;
    do {
      uVar1 = (uint)uVar10;
      uVar7 = uVar1 + 1;
      pDVar3[uVar1 & 0xfff].next_ = uVar7;
      pDVar3[uVar7 & 0xfff].prev_ = uVar1;
      uVar10 = (ulong)uVar7;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  pDVar3 = (this->extras_).array_;
  uVar7 = iVar6 + 0xff;
  pDVar3[uVar2 & 0xfff].prev_ = uVar7;
  pDVar3[uVar7 & 0xfff].next_ = iVar6;
  uVar1 = this->extras_head_;
  uVar10 = (ulong)uVar1 & 0xfff;
  pDVar3[uVar2 & 0xfff].prev_ = pDVar3[uVar10].prev_;
  pDVar3[uVar7 & 0xfff].next_ = uVar1;
  pDVar3[(ulong)pDVar3[uVar10].prev_ & 0xfff].next_ = iVar6;
  pDVar3[uVar10].prev_ = uVar7;
  return;
}

Assistant:

inline void DoubleArrayBuilder::expand_units() {
  id_type src_num_units = units_.size();
  id_type src_num_blocks = num_blocks();

  id_type dest_num_units = src_num_units + BLOCK_SIZE;
  id_type dest_num_blocks = src_num_blocks + 1;

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    fix_block(src_num_blocks - NUM_EXTRA_BLOCKS);
  }

  units_.resize(dest_num_units);

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    for (std::size_t id = src_num_units; id < dest_num_units; ++id) {
      extras(id).set_is_used(false);
      extras(id).set_is_fixed(false);
    }
  }

  for (id_type i = src_num_units + 1; i < dest_num_units; ++i) {
    extras(i - 1).set_next(i);
    extras(i).set_prev(i - 1);
  }

  extras(src_num_units).set_prev(dest_num_units - 1);
  extras(dest_num_units - 1).set_next(src_num_units);

  extras(src_num_units).set_prev(extras(extras_head_).prev());
  extras(dest_num_units - 1).set_next(extras_head_);

  extras(extras(extras_head_).prev()).set_next(src_num_units);
  extras(extras_head_).set_prev(dest_num_units - 1);
}